

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O0

RepeatedField<bool> * __thiscall
google::protobuf::Arena::DoCreateMessage<google::protobuf::RepeatedField<bool>>(Arena *this)

{
  void *ptr;
  RepeatedField<bool> *pRVar1;
  Arena *local_18;
  Arena *local_10;
  Arena *this_local;
  
  local_10 = this;
  ptr = AllocateInternal(this,0x10,8,
                         internal::arena_destruct_object<google::protobuf::RepeatedField<bool>>,
                         (type_info *)&RepeatedField<bool>::typeinfo);
  local_18 = this;
  pRVar1 = InternalHelper<google::protobuf::RepeatedField<bool>>::
           Construct<google::protobuf::Arena*>(ptr,&local_18);
  return pRVar1;
}

Assistant:

PROTOBUF_NDEBUG_INLINE T* DoCreateMessage(Args&&... args) {
    return InternalHelper<T>::Construct(
        AllocateInternal(sizeof(T), alignof(T),
                         internal::ObjectDestructor<
                             InternalHelper<T>::is_destructor_skippable::value,
                             T>::destructor,
                         RTTI_TYPE_ID(T)),
        this, std::forward<Args>(args)...);
  }